

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

void __thiscall blip_eq_t::generate(blip_eq_t *this,float *out,int count)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  double dVar2;
  int i;
  double to_fraction;
  double cutoff;
  double half_rate;
  double oversample;
  undefined4 in_stack_00000030;
  int in_stack_0000004c;
  float *in_stack_00000050;
  int local_3c;
  
  gen_sinc(in_stack_00000050,in_stack_0000004c,(double)this,(double)out,
           (double)CONCAT44(count,in_stack_00000030));
  local_3c = in_EDX;
  while (iVar1 = local_3c + -1, local_3c != 0) {
    dVar2 = cos((double)iVar1 * (3.141592653589793 / (double)(in_EDX + -1)));
    *(float *)(in_RSI + (long)iVar1 * 4) =
         (0.54 - (float)dVar2 * 0.46) * *(float *)(in_RSI + (long)iVar1 * 4);
    local_3c = iVar1;
  }
  return;
}

Assistant:

void blip_eq_t::generate( float* out, int count ) const
{
	// lower cutoff freq for narrow kernels with their wider transition band
	// (8 points->1.49, 16 points->1.15)
	double oversample = blip_res * 2.25 / count + 0.85;
	double half_rate = sample_rate * 0.5;
	if ( cutoff_freq )
		oversample = half_rate / cutoff_freq;
	double cutoff = rolloff_freq * oversample / half_rate;
	
	gen_sinc( out, count, blip_res * oversample, treble, cutoff );
	
	// apply (half of) hamming window
	double to_fraction = PI / (count - 1);
	for ( int i = count; i--; )
		out [i] *= 0.54f - 0.46f * (float) cos( i * to_fraction );
}